

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O2

int __thiscall
ncnn::Spectrogram::forward(Spectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  int k;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float *local_168;
  float norm;
  float local_130;
  float local_12c;
  Spectrogram *local_128;
  ulong local_120;
  Mat local_118;
  ulong local_d0;
  long local_c8;
  void *local_c0;
  ulong local_b8;
  void *local_b0;
  ulong local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  double local_88;
  double local_80;
  Option opt_b;
  
  local_118.data = bottom_blob->data;
  local_118.refcount = bottom_blob->refcount;
  local_118.elemsize = bottom_blob->elemsize;
  local_118.elempack = bottom_blob->elempack;
  local_118.allocator = bottom_blob->allocator;
  local_118.dims = bottom_blob->dims;
  local_118.w = bottom_blob->w;
  local_118.h = bottom_blob->h;
  local_118.d = bottom_blob->d;
  local_118.c = bottom_blob->c;
  local_118.cstep = bottom_blob->cstep;
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + 1;
    UNLOCK();
  }
  if (this->center == 1) {
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar4 = this->pad_type;
    if (iVar4 == 0) {
      iVar4 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_118,0,0,iVar4,iVar4,0,0.0,&opt_b);
      iVar4 = this->pad_type;
    }
    if (iVar4 == 1) {
      iVar4 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_118,0,0,iVar4,iVar4,1,0.0,&opt_b);
      iVar4 = this->pad_type;
    }
    if (iVar4 == 2) {
      iVar4 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_118,0,0,iVar4,iVar4,2,0.0,&opt_b);
    }
  }
  uVar1 = this->n_fft;
  uVar15 = (long)(int)(local_118.w - uVar1) / (long)this->hoplen;
  local_120 = uVar15 & 0xffffffff;
  iVar4 = (int)uVar15 + 1;
  local_d0 = (long)(int)uVar1 / 2 & 0xffffffff;
  uVar7 = (int)((long)(int)uVar1 / 2) + 1;
  if (this->onesided != 0) {
    uVar1 = uVar7;
  }
  if (this->power == 0) {
    Mat::create(top_blob,2,iVar4,uVar1,local_118.elemsize,opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,iVar4,uVar1,local_118.elemsize,opt->blob_allocator);
  }
  local_b0 = top_blob->data;
  iVar13 = -100;
  if ((local_b0 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar15 = 0;
    local_b8 = 0;
    if (0 < (int)uVar7) {
      local_b8 = (ulong)uVar7;
    }
    local_c0 = local_118.data;
    sVar6 = (long)top_blob->w;
    if (this->power == 0) {
      sVar6 = top_blob->cstep;
    }
    local_c8 = sVar6 * top_blob->elemsize;
    local_128 = this;
    while (uVar15 != local_b8) {
      local_168 = (float *)(local_c8 * uVar15 + (long)local_b0);
      uVar1 = this->n_fft;
      local_98 = (long)(int)uVar1;
      local_80 = (double)(int)uVar15 * 6.283185307179586;
      iVar13 = this->power;
      iVar2 = this->normalized;
      local_a0 = (this->window_data).data;
      fVar17 = (float)(1.0 / SQRT((double)(int)uVar1));
      iVar12 = 0;
      uVar8 = 0;
      if (0 < (int)uVar1) {
        uVar8 = (ulong)uVar1;
      }
      local_88 = 1.0 / (double)(int)uVar1;
      local_90 = (long)this->hoplen << 2;
      pvVar14 = local_c0;
      local_a8 = uVar15;
      for (; iVar12 <= (int)local_120; iVar12 = iVar12 + 1) {
        pvVar3 = (this->window_data).data;
        fVar18 = 0.0;
        fVar19 = 0.0;
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          fVar16 = *(float *)((long)pvVar3 + uVar15 * 4) * *(float *)((long)pvVar14 + uVar15 * 4);
          sincosf((float)((double)(int)uVar15 * local_80 * local_88),&local_12c,&local_130);
          fVar18 = fVar18 + local_130 * fVar16;
          fVar19 = fVar19 - fVar16 * local_12c;
        }
        if (iVar2 == 1) {
          fVar18 = fVar18 * fVar17;
          fVar19 = fVar19 * fVar17;
        }
        else if (iVar2 == 2) {
          fVar16 = *(float *)((long)local_a0 + local_98 * 4);
          fVar18 = fVar18 * fVar16;
          fVar19 = fVar19 * fVar16;
        }
        if (iVar13 == 2) {
          *local_168 = fVar19 * fVar19 + fVar18 * fVar18;
LAB_00534212:
          local_168 = local_168 + 1;
        }
        else {
          if (iVar13 == 1) {
            *local_168 = SQRT(fVar19 * fVar19 + fVar18 * fVar18);
            goto LAB_00534212;
          }
          if (iVar13 == 0) {
            *local_168 = fVar18;
            local_168[1] = fVar19;
            local_168 = local_168 + 2;
          }
        }
        pvVar14 = (void *)((long)pvVar14 + local_90);
        this = local_128;
      }
      uVar15 = local_a8 + 1;
    }
    iVar13 = 0;
    if (this->onesided == 0) {
      lVar9 = (long)(int)uVar7;
      uVar15 = ~(long)(int)local_d0;
      iVar13 = 0;
      while( true ) {
        lVar5 = (long)this->n_fft;
        if (lVar5 - lVar9 == 0 || lVar5 < lVar9) break;
        pvVar14 = top_blob->data;
        if (this->power == 0) {
          lVar11 = top_blob->elemsize * top_blob->cstep;
          lVar5 = (lVar5 + uVar15) * lVar11;
          lVar11 = lVar11 * lVar9;
          for (lVar10 = 0; (int)lVar10 <= (int)local_120; lVar10 = lVar10 + 1) {
            *(undefined4 *)((long)pvVar14 + lVar10 * 8 + lVar11) =
                 *(undefined4 *)((long)pvVar14 + lVar10 * 8 + lVar5);
            *(uint *)((long)pvVar14 + lVar10 * 8 + lVar11 + 4) =
                 *(uint *)((long)pvVar14 + lVar10 * 8 + lVar5 + 4) ^ 0x80000000;
          }
        }
        else {
          lVar10 = top_blob->elemsize * (long)top_blob->w;
          memcpy((void *)(lVar10 * lVar9 + (long)pvVar14),
                 (void *)((lVar5 - lVar9) * lVar10 + (long)pvVar14),(long)iVar4 << 2);
        }
        lVar9 = lVar9 + 1;
        uVar15 = uVar15 - 1;
      }
    }
  }
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (*local_118.refcount == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int Spectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://pytorch.org/audio/stable/generated/torchaudio.functional.spectrogram.html

    // TODO custom window

    Mat bottom_blob_bordered = bottom_blob;
    if (center == 1)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        if (pad_type == 0)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_CONSTANT, 0.f, opt_b);
        if (pad_type == 1)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REPLICATE, 0.f, opt_b);
        if (pad_type == 2)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REFLECT, 0.f, opt_b);
    }

    const int size = bottom_blob_bordered.w;

    // const int frames = size / hoplen + 1;
    const int frames = (size - n_fft) / hoplen + 1;
    const int freqs_onesided = n_fft / 2 + 1;
    const int freqs = onesided ? freqs_onesided : n_fft;

    const size_t elemsize = bottom_blob_bordered.elemsize;

    if (power == 0)
    {
        top_blob.create(2, frames, freqs, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(frames, freqs, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < freqs_onesided; i++)
    {
        const float* ptr = bottom_blob_bordered;
        float* outptr = power == 0 ? top_blob.channel(i) : top_blob.row(i);

        for (int j = 0; j < frames; j++)
        {
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                float v = ptr[k];

                // apply window
                v *= window_data[k];

                // dft
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += v * cosf(angle); // + imag * sinf(angle);
                im -= v * sinf(angle); // + imag * cosf(angle);
            }

            if (normalized == 1)
            {
                float norm = 1.f / sqrt(n_fft);
                re *= norm;
                im *= norm;
            }
            if (normalized == 2)
            {
                float norm = window_data[n_fft];
                re *= norm;
                im *= norm;
            }

            if (power == 0)
            {
                // complex as real
                outptr[0] = re;
                outptr[1] = im;
                outptr += 2;
            }
            if (power == 1)
            {
                // magnitude
                outptr[0] = sqrt(re * re + im * im);
                outptr += 1;
            }
            if (power == 2)
            {
                outptr[0] = re * re + im * im;
                outptr += 1;
            }

            ptr += hoplen;
        }
    }

    if (!onesided)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = freqs_onesided; i < n_fft; i++)
        {
            if (power == 0)
            {
                const float* ptr = top_blob.channel(n_fft - i);
                float* outptr = top_blob.channel(i);

                for (int j = 0; j < frames; j++)
                {
                    // complex as real
                    outptr[0] = ptr[0];
                    outptr[1] = -ptr[1];
                    ptr += 2;
                    outptr += 2;
                }
            }
            else // if (power == 1 || power == 2)
            {
                const float* ptr = top_blob.row(n_fft - i);
                float* outptr = top_blob.row(i);

                memcpy(outptr, ptr, frames * sizeof(float));
            }
        }
    }

    return 0;
}